

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  byte *pbVar1;
  size_t sVar2;
  byte c;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  lws_tokenize_elem lVar7;
  ulong uVar8;
  size_t sVar9;
  void *pvVar10;
  uint uVar11;
  bool bVar12;
  uint uVar13;
  bool bVar14;
  uint __c;
  uint uVar15;
  int iVar16;
  long lVar17;
  byte *pbVar18;
  bool bVar19;
  char local_68;
  char local_64;
  
  uVar3 = ts->flags;
  iVar16 = 0;
  local_64 = ((uVar3 >> 6 & 1) != 0) + -1;
  uVar13 = uVar3 & 1;
  uVar4 = 0x2d;
  if ((uVar3 & 1) != 0) {
    uVar13 = 0x2d;
    uVar4 = 0;
  }
  uVar11 = uVar3 & 0x10;
  uVar5 = 0x2e;
  if ((uVar3 & 0x10) != 0) {
    uVar11 = 0x2e;
    uVar5 = 0;
  }
  ts->token = (char *)0x0;
  ts->token_len = 0;
  if (ts->len == 0) {
    bVar19 = true;
    bVar12 = false;
  }
  else {
    bVar19 = true;
    iVar6 = 0;
    bVar12 = false;
    lVar17 = 0;
    sVar9 = ts->len;
    pbVar18 = (byte *)ts->start;
    do {
      pbVar1 = pbVar18 + 1;
      ts->start = (char *)pbVar1;
      c = *pbVar18;
      sVar2 = sVar9 - 1;
      ts->len = sVar2;
      iVar6 = lws_check_byte_utf8((uchar)iVar6,c);
      if (iVar6 < 0) {
        return LWS_TOKZE_ERR_BROKEN_UTF8;
      }
      if (c == 0) break;
      if (((bVar19) || (c == 0xd)) || (c == 10)) {
        local_68 = (char)uVar3;
        uVar15 = (uint)lVar17;
        if (((local_68 < '\0') && (uVar15 != 1)) && (c == 0x23)) goto LAB_0010ee75;
        if (c < 0x3e) {
          uVar8 = (ulong)c;
          if ((0x100003600U >> (uVar8 & 0x3f) & 1) != 0) {
            lVar7 = (*(code *)(&DAT_00139f10 + *(int *)(&DAT_00139f10 + lVar17 * 4)))();
            return lVar7;
          }
          if (uVar8 != 0x22) {
            if ((uVar8 == 0x3d) && ((uVar15 & 0xfffffffe) == 2)) {
              if (local_64 == '\x01') {
                return LWS_TOKZE_ERR_NUM_ON_LHS;
              }
              return LWS_TOKZE_ERRS;
            }
            goto LAB_0010eee5;
          }
          if (uVar15 == 1) {
            return LWS_TOKZE_QUOTED_STRING;
          }
          if ((uVar3 & 4) != 0) {
            if (ts->delim == '\x01') {
              return LWS_TOKZE_ERR_COMMA_LIST;
            }
            ts->delim = '\x01';
          }
          ts->token = (char *)pbVar1;
          ts->token_len = 0;
          lVar17 = 1;
          bVar19 = true;
        }
        else {
LAB_0010eee5:
          if ((((uVar15 & 0xfffffffe) == 2 && c == 0x3a) & (byte)((uVar3 & 2) >> 1)) != 0) {
            return LWS_TOKZE_TOKEN_NAME_COLON;
          }
          if ((((c == 0x2e) && ((uVar3 & 0x20) == 0)) && (uVar15 == 2)) && (local_64 == '\x01')) {
            if (bVar12) {
              return LWS_TOKZE_ERR_MALFORMED_FLOAT;
            }
            ts->token_len = ts->token_len + 1;
            bVar12 = true;
            lVar17 = 2;
            bVar19 = true;
          }
          else if (((iVar6 == 0) &&
                   ((((__c = (uint)(char)c, (uVar3 & 8) != 0 &&
                      (pvVar10 = memchr("(),/:;<=>?@[\\]{}",__c,0x11), ' ' < (char)c)) &&
                     (pvVar10 != (void *)0x0)) ||
                    (((((uVar3 & 8) == 0 && ((byte)(c - 0x3a) < 0xf6)) &&
                      (((byte)(c + 0xa5) < 0xe6 &&
                       (((uVar13 != __c && c != 0x5f) && (byte)(c + 0x85) < 0xe6) && uVar11 != __c))
                      )) || ((uVar4 == __c || (uVar5 == __c)))))))) &&
                  (((uVar3 >> 8 & 1) == 0 || (c != 0x2f)))) {
            if (uVar15 != 1) {
              if (1 < uVar15 - 2) {
                if ((uVar3 & 4) != 0) {
                  if (c != 0x2c) {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  if (ts->delim != '\x01') {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  ts->delim = '\x02';
                }
                ts->token = (char *)pbVar18;
                ts->token_len = 1;
                return LWS_TOKZE_DELIMITER;
              }
LAB_0010f173:
              ts->start = (char *)pbVar18;
              ts->len = sVar9;
              goto LAB_0010f17f;
            }
            ts->token_len = ts->token_len + 1;
            iVar6 = 0;
            bVar19 = true;
            lVar17 = 1;
          }
          else {
            if (uVar15 - 1 < 2) {
              sVar9 = ts->token_len + 1;
            }
            else {
              if (uVar15 != 0) goto LAB_0010f173;
              if ((uVar3 & 4) != 0) {
                if (ts->delim == '\x01') {
                  return LWS_TOKZE_ERR_COMMA_LIST;
                }
                ts->delim = '\x01';
              }
              ts->token = (char *)pbVar18;
              lVar17 = 2;
              sVar9 = 1;
            }
            ts->token_len = sVar9;
            bVar14 = true;
            bVar19 = true;
            if ((uVar3 & 0x40) == 0) {
              bVar19 = bVar14;
              if ((byte)(c - 0x3a) < 0xf6) {
                local_64 = '\0';
              }
              else if (local_64 < '\0') {
                local_64 = '\x01';
              }
            }
          }
        }
      }
      else {
LAB_0010ee75:
        bVar19 = false;
      }
      sVar9 = sVar2;
      pbVar18 = pbVar1;
    } while (sVar2 != 0);
    iVar16 = (int)lVar17;
    bVar19 = iVar6 == 0;
  }
  lVar7 = LWS_TOKZE_ERR_BROKEN_UTF8;
  if ((bVar19) && (lVar7 = LWS_TOKZE_ERR_UNTERM_STRING, iVar16 != 1)) {
    if (iVar16 - 4U < 0xfffffffe) {
      if (((uVar3 & 4) == 0) || (lVar7 = LWS_TOKZE_ERR_COMMA_LIST, ts->delim != '\x02')) {
        lVar7 = LWS_TOKZE_ENDED;
      }
    }
    else {
LAB_0010f17f:
      lVar7 = LWS_TOKZE_TOKEN;
      if (local_64 == '\x01') {
        lVar7 = LWS_TOKZE_FLOAT - (uint)!bVar12;
      }
    }
  }
  return lVar7;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', s_minus = '\0',
	     s_dot = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot) ||
		    c == d_minus || c == d_dot
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}